

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_p.h
# Opt level: O0

void __thiscall QPaintEnginePrivate::updateSystemClip(QPaintEnginePrivate *this)

{
  int iVar1;
  ulong uVar2;
  QRect *this_00;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QRect *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QSize *asize;
  QPoint *in_stack_ffffffffffffffb8;
  undefined1 local_28 [16];
  QRegion local_18;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  asize = in_RDI;
  QRegion::operator=((QRegion *)(in_RDI + 4),(QRegion *)(in_RDI + 3));
  uVar2 = QRegion::isEmpty();
  if ((uVar2 & 1) == 0) {
    if ((in_RDI[0x13].wd.m_i & 1) != 0) {
      iVar1 = QTransform::type();
      if (iVar1 < 2) {
        in_stack_ffffffffffffff98 = (QRect *)(in_RDI + 4);
        QTransform::dx((QTransform *)(in_RDI + 8));
        in_stack_ffffffffffffffa4 = qRound(1.84335892463369e-317);
        QTransform::dy((QTransform *)(in_RDI + 8));
        qRound(1.84337028814355e-317);
        QRegion::translate((int)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa4);
      }
      else {
        QTransform::map((QRegion *)&local_10);
        QRegion::operator=((QRegion *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (QRegion *)in_stack_ffffffffffffff98);
        QRegion::~QRegion(&local_10);
      }
    }
    if (((byte)in_RDI[0x13].wd.m_i >> 1 & 1) != 0) {
      QRegion::operator&=((QRegion *)(in_RDI + 4),(QRegion *)(in_RDI + 7));
      uVar2 = QRegion::isEmpty();
      if ((uVar2 & 1) != 0) {
        this_00 = (QRect *)QRegion::boundingRect();
        QRect::topLeft(in_stack_ffffffffffffff98);
        QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98)
        ;
        QRect::QRect(this_00,in_stack_ffffffffffffffb8,asize);
        QRegion::QRegion(&local_18,(QRect *)local_28,Rectangle);
        QRegion::operator=((QRegion *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (QRegion *)in_stack_ffffffffffffff98);
        QRegion::~QRegion(&local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void updateSystemClip()
    {
        systemClip = baseSystemClip;
        if (systemClip.isEmpty())
            return;

        if (hasSystemTransform) {
            if (systemTransform.type() <= QTransform::TxTranslate)
                systemClip.translate(qRound(systemTransform.dx()), qRound(systemTransform.dy()));
            else
                systemClip = systemTransform.map(systemClip);
        }

        // Make sure we're inside the viewport.
        if (hasSystemViewport) {
            systemClip &= systemViewport;
            if (systemClip.isEmpty()) {
                // We don't want to paint without system clip, so set it to 1 pixel :)
                systemClip = QRect(systemViewport.boundingRect().topLeft(), QSize(1, 1));
            }
        }
    }